

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBootstrapCommands1.cxx
# Opt level: O1

void GetBootstrapCommands1(vector<cmCommand_*,_std::allocator<cmCommand_*>_> *commands)

{
  pointer *pppcVar1;
  iterator iVar2;
  cmFindPackageCommand *pcVar3;
  cmFindPackageCommand *local_18;
  
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c9be0;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c9c68;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c9cf0;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c9d78;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c9e00;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c9e88;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c9f10;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005c9f98;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005ca020;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005ca0a8;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x68);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCMakeMinimumRequired_005ca140;
  (local_18->super_cmFindCommon).UserHintsArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->super_cmFindCommon).UserHintsArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_18->super_cmFindCommon).UserHintsArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005ca1c8;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  pcVar3 = (cmFindPackageCommand *)operator_new(0xa0);
  (pcVar3->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(pcVar3->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(pcVar3->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (pcVar3->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(pcVar3->super_cmFindCommon).super_cmCommand.Error.field_2;
  (pcVar3->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (pcVar3->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (pcVar3->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (pcVar3->super_cmFindCommon).super_cmCommand.Enabled = true;
  (pcVar3->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmConfigureFileCommand_005ca2b0;
  cmNewLineStyle::cmNewLineStyle((cmNewLineStyle *)&(pcVar3->super_cmFindCommon).UserHintsArgs);
  (pcVar3->super_cmFindCommon).UserHintsArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&(pcVar3->super_cmFindCommon).UserGuessArgs;
  (pcVar3->super_cmFindCommon).UserHintsArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &(pcVar3->super_cmFindCommon).UserGuessArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  (pcVar3->super_cmFindCommon).UserGuessArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&(pcVar3->super_cmFindCommon).CMakePathName._M_string_length;
  (pcVar3->super_cmFindCommon).CMakePathName._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)&(pcVar3->super_cmFindCommon).CMakePathName._M_string_length = 0;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_18 = pcVar3;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)pcVar3;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005ca338;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005ca3c0;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0xb0);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmDefinePropertyCommand_005ca448;
  (local_18->super_cmFindCommon).UserHintsArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&(local_18->super_cmFindCommon).UserHintsArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_18->super_cmFindCommon).UserHintsArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   &(local_18->super_cmFindCommon).UserHintsArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  (local_18->super_cmFindCommon).UserGuessArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = &(local_18->super_cmFindCommon).CMakePathName;
  (local_18->super_cmFindCommon).UserGuessArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)&(local_18->super_cmFindCommon).CMakePathName._M_dataplus._M_p = 0;
  (local_18->super_cmFindCommon).CMakePathName.field_2._M_allocated_capacity =
       (size_type)&(local_18->super_cmFindCommon).FindRootPathMode;
  *(undefined8 *)((long)&(local_18->super_cmFindCommon).CMakePathName.field_2 + 8) = 0;
  *(undefined1 *)&(local_18->super_cmFindCommon).FindRootPathMode = RootPathModeNever;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005ca4d0;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005ca558;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005ca5e0;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005ca668;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005ca6f0;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005ca778;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005ca800;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005ca888;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005ca910;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005ca998;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005caa50;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  pcVar3 = (cmFindPackageCommand *)operator_new(0x248);
  cmFindPathCommand::cmFindPathCommand((cmFindPathCommand *)pcVar3);
  (pcVar3->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmFindBase_005caeb0;
  *(undefined1 *)((long)&(pcVar3->Version).field_2 + 2) = 1;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_18 = pcVar3;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)pcVar3;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  pcVar3 = (cmFindPackageCommand *)operator_new(0x248);
  cmFindLibraryCommand::cmFindLibraryCommand((cmFindLibraryCommand *)pcVar3);
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_18 = pcVar3;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)pcVar3;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  pcVar3 = (cmFindPackageCommand *)operator_new(0x370);
  cmFindPackageCommand::cmFindPackageCommand(pcVar3);
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_18 = pcVar3;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)pcVar3;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  pcVar3 = (cmFindPackageCommand *)operator_new(0x248);
  cmFindPathCommand::cmFindPathCommand((cmFindPathCommand *)pcVar3);
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_18 = pcVar3;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)pcVar3;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  pcVar3 = (cmFindPackageCommand *)operator_new(0x248);
  cmFindBase::cmFindBase((cmFindBase *)pcVar3);
  (pcVar3->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmFindBase_005c9b38;
  *(undefined1 *)((long)&(pcVar3->Variable)._M_string_length + 1) = 1;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_18 = pcVar3;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)pcVar3;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005cac30;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005cad18;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmFindPackageCommand *)operator_new(0x50);
  (local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmFindCommon).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmFindCommon).super_cmCommand.Error.field_2;
  (local_18->super_cmFindCommon).super_cmCommand.Error._M_string_length = 0;
  (local_18->super_cmFindCommon).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmFindCommon).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_18->super_cmFindCommon).super_cmCommand.Enabled = true;
  (local_18->super_cmFindCommon).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_005cae28;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

void GetBootstrapCommands1(std::vector<cmCommand*>& commands)
{
  commands.push_back(new cmAddCustomCommandCommand);
  commands.push_back(new cmAddCustomTargetCommand);
  commands.push_back(new cmAddDefinitionsCommand);
  commands.push_back(new cmAddDependenciesCommand);
  commands.push_back(new cmAddExecutableCommand);
  commands.push_back(new cmAddLibraryCommand);
  commands.push_back(new cmAddSubDirectoryCommand);
  commands.push_back(new cmAddTestCommand);
  commands.push_back(new cmBreakCommand);
  commands.push_back(new cmBuildCommand);
  commands.push_back(new cmCMakeMinimumRequired);
  commands.push_back(new cmCMakePolicyCommand);
  commands.push_back(new cmConfigureFileCommand);
  commands.push_back(new cmContinueCommand);
  commands.push_back(new cmCreateTestSourceList);
  commands.push_back(new cmDefinePropertyCommand);
  commands.push_back(new cmElseCommand);
  commands.push_back(new cmEnableLanguageCommand);
  commands.push_back(new cmEnableTestingCommand);
  commands.push_back(new cmEndForEachCommand);
  commands.push_back(new cmEndFunctionCommand);
  commands.push_back(new cmEndIfCommand);
  commands.push_back(new cmEndMacroCommand);
  commands.push_back(new cmEndWhileCommand);
  commands.push_back(new cmExecProgramCommand);
  commands.push_back(new cmExecuteProcessCommand);
  commands.push_back(new cmFileCommand);
  commands.push_back(new cmFindFileCommand);
  commands.push_back(new cmFindLibraryCommand);
  commands.push_back(new cmFindPackageCommand);
  commands.push_back(new cmFindPathCommand);
  commands.push_back(new cmFindProgramCommand);
  commands.push_back(new cmForEachCommand);
  commands.push_back(new cmFunctionCommand);
  commands.push_back(new cmParseArgumentsCommand);
}